

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_edit_player_exp(command *cmd)

{
  int iVar1;
  _Bool _Var2;
  long lVar3;
  long newv;
  char s [80];
  long local_70;
  char local_68 [88];
  
  if (edit_player_state != EDIT_PLAYER_BREAK) {
    strnfmt(local_68,0x50,"%ld",(long)player->exp);
    _Var2 = get_string("Experience: ",local_68,0x50);
    if ((_Var2) && (_Var2 = get_long_from_string(local_68,&local_70), _Var2)) {
      lVar3 = 0;
      if (0 < local_70) {
        lVar3 = local_70;
      }
      if (0x5f5e0fe < lVar3) {
        lVar3 = 99999999;
      }
      iVar1 = player->exp;
      local_70 = lVar3;
      if (iVar1 < lVar3) {
        player_exp_gain(player,(int)lVar3 - iVar1);
      }
      else {
        player_exp_lose(player,iVar1 - (int)lVar3,false);
      }
    }
    else {
      edit_player_state = EDIT_PLAYER_BREAK;
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_edit_player_exp(struct command *cmd)
{
	char s[80];
	long newv;

	if (edit_player_state == EDIT_PLAYER_BREAK) return;

	/* Set default value. */
	strnfmt(s, sizeof(s), "%ld", (long)(player->exp));

	if (!get_string("Experience: ", s, sizeof(s)) ||
			!get_long_from_string(s, &newv)) {
		/* Set next editing stage to break. */
		edit_player_state = EDIT_PLAYER_BREAK;
		return;
	}

	/* Keep in the bounds of [0, PY_MAX_EXP]. */
	newv = MIN(PY_MAX_EXP, MAX(0, newv));

	if (newv > player->exp) {
		player_exp_gain(player, newv - player->exp);
	} else {
		player_exp_lose(player, player->exp - newv, false);
	}
}